

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

If_Man_t * Abc_NtkToIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  If_Man_t *p;
  char *pcVar4;
  If_Obj_t *pIVar5;
  Abc_Obj_t *pAVar6;
  ProgressBar *p_00;
  Vec_Ptr_t *p_01;
  If_Obj_t *pIVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *local_50;
  Abc_Obj_t *pEquiv;
  Abc_Obj_t *pAStack_40;
  int i;
  Abc_Obj_t *pPrev;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  If_Man_t *pIfMan;
  ProgressBar *pProgress;
  If_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0xd9,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
  }
  p = If_ManStart(pPars);
  pcVar4 = Abc_NtkName(pNtk);
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p->pName = pcVar4;
  iVar1 = Abc_NtkObjNum(pNtk);
  if (1.0 < ((double)iVar1 * 1.0 * (double)p->nObjBytes) / 1073741824.0) {
    iVar2 = Abc_NtkObjNum(pNtk);
    iVar1 = p->nObjBytes;
    uVar3 = Abc_NtkObjNum(pNtk);
    printf("Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
           ,((double)iVar2 * 1.0 * (double)iVar1) / 1073741824.0,(ulong)uVar3);
  }
  Abc_NtkCleanCopy(pNtk);
  pIVar5 = If_ManConst1(p);
  pAVar6 = Abc_AigConst1(pNtk);
  (pAVar6->field_6).pCopy = (Abc_Obj_t *)pIVar5;
  for (pEquiv._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), pFile = _stdout, pEquiv._4_4_ < iVar1;
      pEquiv._4_4_ = pEquiv._4_4_ + 1) {
    pAVar6 = Abc_NtkCi(pNtk,pEquiv._4_4_);
    pIVar5 = If_ManCreateCi(p);
    (pAVar6->field_6).pCopy = (Abc_Obj_t *)pIVar5;
    uVar3 = *(uint *)&pAVar6->field_0x14;
    pIVar5 = Abc_ObjIfCopy(pAVar6);
    *(uint *)pIVar5 = *(uint *)pIVar5 & 0x1fff | (uVar3 >> 0xc) << 0xd;
  }
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_00 = Extra_ProgressBarStart(pFile,iVar1);
  p_01 = Abc_AigDfs(pNtk,0,0);
  pEquiv._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(p_01);
    if (iVar1 <= pEquiv._4_4_) {
      Extra_ProgressBarStop(p_00);
      Vec_PtrFree(p_01);
      for (pEquiv._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), pEquiv._4_4_ < iVar1;
          pEquiv._4_4_ = pEquiv._4_4_ + 1) {
        pAVar6 = Abc_NtkCo(pNtk,pEquiv._4_4_);
        pAVar8 = Abc_ObjFanin0(pAVar6);
        pIVar5 = Abc_ObjIfCopy(pAVar8);
        iVar1 = Abc_ObjFaninC0(pAVar6);
        pIVar5 = If_NotCond(pIVar5,iVar1);
        pIVar5 = If_ManCreateCo(p,pIVar5);
        (pAVar6->field_6).pCopy = (Abc_Obj_t *)pIVar5;
      }
      return p;
    }
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p_01,pEquiv._4_4_);
    Extra_ProgressBarUpdate(p_00,pEquiv._4_4_,"Initial");
    pAVar8 = Abc_ObjFanin0(pAVar6);
    pIVar5 = Abc_ObjIfCopy(pAVar8);
    iVar1 = Abc_ObjFaninC0(pAVar6);
    pIVar5 = If_NotCond(pIVar5,iVar1);
    pAVar8 = Abc_ObjFanin1(pAVar6);
    pIVar7 = Abc_ObjIfCopy(pAVar8);
    iVar1 = Abc_ObjFaninC1(pAVar6);
    pIVar7 = If_NotCond(pIVar7,iVar1);
    pIVar5 = If_ManCreateAnd(p,pIVar5,pIVar7);
    (pAVar6->field_6).pCopy = (Abc_Obj_t *)pIVar5;
    iVar1 = Abc_AigNodeIsChoice(pAVar6);
    if (iVar1 != 0) {
      pIVar5 = Abc_ObjIfCopy(pAVar6);
      iVar1 = If_ObjId(pIVar5);
      pAVar8 = Abc_ObjEquiv(pAVar6);
      pIVar5 = Abc_ObjIfCopy(pAVar8);
      iVar2 = If_ObjId(pIVar5);
      if (iVar1 <= iVar2) {
        __assert_fail("If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0xfd,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
      }
      local_50 = Abc_ObjEquiv(pAVar6);
      pAStack_40 = pAVar6;
      for (; local_50 != (Abc_Obj_t *)0x0; local_50 = Abc_ObjEquiv(local_50)) {
        pIVar5 = Abc_ObjIfCopy(pAStack_40);
        pIVar7 = Abc_ObjIfCopy(local_50);
        If_ObjSetChoice(pIVar5,pIVar7);
        pAStack_40 = local_50;
      }
      pIVar5 = Abc_ObjIfCopy(pAVar6);
      If_ManCreateChoice(p,pIVar5);
    }
    pEquiv._4_4_ = pEquiv._4_4_ + 1;
  } while( true );
}

Assistant:

If_Man_t * Abc_NtkToIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    ProgressBar * pProgress;
    If_Man_t * pIfMan;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );

    // print warning about excessive memory usage
    if ( 1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30), Abc_NtkObjNum(pNtk) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)If_ManConst1( pIfMan );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCi( pIfMan );
        // transfer logic level information
        Abc_ObjIfCopy(pNode)->Level = pNode->Level;
    }

    // load the AIG into the mapper
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, "Initial" );
        // add the node to the mapper
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateAnd( pIfMan, 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ), 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin1(pNode)), Abc_ObjFaninC1(pNode) ) );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
        {
            Abc_Obj_t * pEquiv;
//            int Counter = 0;
            assert( If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode))) );
            for ( pPrev = pNode, pEquiv = Abc_ObjEquiv(pPrev); pEquiv; pPrev = pEquiv, pEquiv = Abc_ObjEquiv(pPrev) )
                If_ObjSetChoice( Abc_ObjIfCopy(pPrev), Abc_ObjIfCopy(pEquiv) );//, Counter++;
//            printf( "%d ", Counter );
            If_ManCreateChoice( pIfMan, Abc_ObjIfCopy(pNode) );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );

    // set the primary outputs without copying the phase
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCo( pIfMan, If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ) );
    return pIfMan;
}